

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dSFMT.c
# Opt level: O1

void dsfmt_chk_init_by_array(dsfmt_t *dsfmt,uint32_t *init_key,int key_length,int mexp)

{
  int *piVar1;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar2;
  iterator iVar3;
  uint64_t uVar4;
  ulong *puVar5;
  pointer puVar6;
  pointer pvVar7;
  int i;
  long lVar8;
  ostream *poVar9;
  ulong uVar10;
  uint *puVar11;
  uint *puVar12;
  uint uVar13;
  int iVar14;
  uint32_t uVar15;
  uint uVar16;
  int extraout_EDX;
  ulong uVar17;
  long *plVar18;
  ulong *puVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  uint uVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  bool bVar33;
  bool bVar34;
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  uint uStack_14c;
  dsfmt_t *pdStack_148;
  allocator_type aStack_139;
  size_type sStack_138;
  uint uStack_130;
  int iStack_12c;
  ulong uStack_128;
  vector<bool,_std::allocator<bool>_> vStack_120;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  vStack_f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vStack_e0;
  long lStack_c8;
  ulong uStack_c0;
  undefined8 uStack_b8;
  long lStack_a8;
  long lStack_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vStack_98;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvStack_80;
  long lStack_78;
  long lStack_70;
  double dStack_68;
  ulong uStack_60;
  pointer pvStack_58;
  pointer pvStack_50;
  
  if (mexp == 0x4de1) {
    memset(dsfmt,0x8b,0xc00);
    uVar16 = 0x2ff;
    if (0x2ff < key_length) {
      uVar16 = key_length;
    }
    uVar25 = *(uint *)((long)dsfmt->status + 0x5e8);
    uVar13 = *(uint *)((long)dsfmt->status + 0xbfc) ^ uVar25 ^ 0x8b8b8b8b;
    iVar14 = (uVar13 >> 0x1b ^ uVar13) * 0x19660d;
    *(uint *)((long)dsfmt->status + 0x5e8) = uVar25 + iVar14;
    uVar15 = iVar14 + key_length;
    piVar1 = (int *)((long)dsfmt->status + 0x614);
    *piVar1 = *piVar1 + uVar15;
    dsfmt->status[0].u32[0] = uVar15;
    if (key_length < 1) {
      iVar14 = 1;
      uVar10 = 0;
    }
    else {
      iVar14 = 1;
      uVar10 = 0;
      do {
        iVar26 = iVar14 + 0x17a >> 0x1f;
        iVar28 = (((uint)((iVar14 + 0x17a) / 6 + iVar26) >> 7) - iVar26) * -0x300 + iVar14 + 0x17a;
        iVar26 = iVar14 + 0x2ff >> 0x1f;
        uVar25 = dsfmt->status[0].u32[iVar14] ^
                 dsfmt->status[0].u32
                 [(int)((((uint)((iVar14 + 0x2ff) / 6 + iVar26) >> 7) - iVar26) * -0x300 + iVar14 +
                       0x2ff)] ^ dsfmt->status[0].u32[iVar28];
        iVar26 = (uVar25 >> 0x1b ^ uVar25) * 0x19660d;
        dsfmt->status[0].u32[iVar28] = dsfmt->status[0].u32[iVar28] + iVar26;
        uVar15 = init_key[uVar10] + iVar14 + iVar26;
        iVar26 = iVar14 + 0x185 >> 0x1f;
        dsfmt->status[0].u32
        [(int)((((uint)((iVar14 + 0x185) / 6 + iVar26) >> 7) - iVar26) * -0x300 + iVar14 + 0x185)] =
             dsfmt->status[0].u32
             [(int)((((uint)((iVar14 + 0x185) / 6 + iVar26) >> 7) - iVar26) * -0x300 + iVar14 +
                   0x185)] + uVar15;
        dsfmt->status[0].u32[iVar14] = uVar15;
        iVar26 = iVar14 + 1 >> 0x1f;
        iVar14 = iVar14 + (((uint)((iVar14 + 1) / 6 + iVar26) >> 7) - iVar26) * -0x300 + 1;
        uVar10 = uVar10 + 1;
      } while ((uint)key_length != uVar10);
    }
    iVar26 = uVar16 - (uint)uVar10;
    if ((uint)uVar10 <= uVar16 && iVar26 != 0) {
      do {
        iVar28 = iVar14 + 0x17a >> 0x1f;
        iVar23 = (((uint)((iVar14 + 0x17a) / 6 + iVar28) >> 7) - iVar28) * -0x300 + iVar14 + 0x17a;
        iVar28 = iVar14 + 0x2ff >> 0x1f;
        uVar16 = dsfmt->status[0].u32[iVar14] ^
                 dsfmt->status[0].u32
                 [(int)((((uint)((iVar14 + 0x2ff) / 6 + iVar28) >> 7) - iVar28) * -0x300 + iVar14 +
                       0x2ff)] ^ dsfmt->status[0].u32[iVar23];
        iVar28 = (uVar16 >> 0x1b ^ uVar16) * 0x19660d;
        dsfmt->status[0].u32[iVar23] = dsfmt->status[0].u32[iVar23] + iVar28;
        uVar15 = iVar28 + iVar14;
        iVar28 = iVar14 + 0x185 >> 0x1f;
        dsfmt->status[0].u32
        [(int)((((uint)((iVar14 + 0x185) / 6 + iVar28) >> 7) - iVar28) * -0x300 + iVar14 + 0x185)] =
             dsfmt->status[0].u32
             [(int)((((uint)((iVar14 + 0x185) / 6 + iVar28) >> 7) - iVar28) * -0x300 + iVar14 +
                   0x185)] + uVar15;
        dsfmt->status[0].u32[iVar14] = uVar15;
        iVar28 = iVar14 + 1 >> 0x1f;
        iVar14 = iVar14 + (((uint)((iVar14 + 1) / 6 + iVar28) >> 7) - iVar28) * -0x300 + 1;
        iVar26 = iVar26 + -1;
      } while (iVar26 != 0);
    }
    iVar26 = 0x300;
    do {
      iVar28 = iVar14 + 0x17a >> 0x1f;
      iVar23 = (((uint)((iVar14 + 0x17a) / 6 + iVar28) >> 7) - iVar28) * -0x300 + iVar14 + 0x17a;
      iVar28 = iVar14 + 0x2ff >> 0x1f;
      uVar16 = dsfmt->status[0].u32[iVar14] + dsfmt->status[0].u32[iVar23] +
               dsfmt->status[0].u32
               [(int)((((uint)((iVar14 + 0x2ff) / 6 + iVar28) >> 7) - iVar28) * -0x300 + iVar14 +
                     0x2ff)];
      uVar16 = (uVar16 >> 0x1b ^ uVar16) * 0x5d588b65;
      dsfmt->status[0].u32[iVar23] = dsfmt->status[0].u32[iVar23] ^ uVar16;
      uVar16 = uVar16 - iVar14;
      iVar28 = iVar14 + 0x185 >> 0x1f;
      dsfmt->status[0].u32
      [(int)((((uint)((iVar14 + 0x185) / 6 + iVar28) >> 7) - iVar28) * -0x300 + iVar14 + 0x185)] =
           dsfmt->status[0].u32
           [(int)((((uint)((iVar14 + 0x185) / 6 + iVar28) >> 7) - iVar28) * -0x300 + iVar14 + 0x185)
           ] ^ uVar16;
      dsfmt->status[0].u32[iVar14] = uVar16;
      iVar28 = iVar14 + 1 >> 0x1f;
      iVar14 = iVar14 + (((uint)((iVar14 + 1) / 6 + iVar28) >> 7) - iVar28) * -0x300 + 1;
      iVar26 = iVar26 + -1;
    } while (iVar26 != 0);
    lVar8 = 0;
    do {
      dsfmt->status[0].u[lVar8] = dsfmt->status[0].u[lVar8] & 0xfffffffffffff | 0x3ff0000000000000;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x17e);
    uVar10 = *(ulong *)((long)dsfmt->status + 0xbf8);
    uVar17 = ((ulong)((uint)uVar10 & 1) | dsfmt->status[0xbf].u[0] & 0x3d84e1ac0dc82880) ^
             0x1000412401080000;
    uVar16 = 0x20;
    do {
      uVar17 = uVar17 >> (sbyte)uVar16 ^ uVar17;
      bVar33 = 1 < uVar16;
      uVar16 = uVar16 >> 1;
    } while (bVar33);
    if ((uVar17 & 1) == 0) {
      *(ulong *)((long)dsfmt->status + 0xbf8) = uVar10 ^ 1;
    }
    dsfmt->idx = 0x17e;
    return;
  }
  dsfmt_chk_init_by_array_cold_1();
  uStack_130 = (uint)init_key;
  dsfmt->status[2].u[0] = 0x7fefffffffffffff;
  *(undefined8 *)((long)dsfmt->status + 0x28) = 0x7fefffffffffffff;
  vStack_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  iStack_12c = extraout_EDX;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&vStack_e0,(ulong)dsfmt->status[0].u32[0],(value_type_conflict2 *)&vStack_120,
             (allocator_type *)&vStack_f8);
  uVar10 = (ulong)dsfmt->status[0].u32[0];
  if (uVar10 == 0) {
    uVar17 = 0;
  }
  else {
    plVar18 = (long *)(dsfmt->status[0xb].u[0] + uVar10 * 0x18 + -0x10);
    uVar17 = 0;
    do {
      uVar24 = *plVar18 - plVar18[-1] >> 3;
      if (uVar17 < uVar24) {
        uVar17 = uVar24;
      }
      plVar18 = plVar18 + -3;
      vStack_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar10 - 1] = uVar24;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&vStack_f8,uVar17 + 1,(allocator_type *)&vStack_120);
  uVar16 = dsfmt->status[0].u32[0] - 1;
  vStack_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT44(vStack_120.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,uVar16);
  if (dsfmt->status[0].u32[0] != 0) {
    do {
      if (vStack_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar16] != 0) {
        pvVar2 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                 (vStack_f8.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                 vStack_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar16]);
        iVar3._M_current = *(uint **)(pvVar2 + 8);
        if (iVar3._M_current == *(uint **)(pvVar2 + 0x10)) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar3,(uint *)&vStack_120);
        }
        else {
          *iVar3._M_current = uVar16;
          *(uint **)(pvVar2 + 8) = iVar3._M_current + 1;
        }
      }
      bVar33 = (int)vStack_120.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != 0;
      uVar16 = (int)vStack_120.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p - 1;
      vStack_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p =
           (_Bit_type *)
           CONCAT44(vStack_120.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,uVar16);
    } while (bVar33);
  }
  vStack_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&vStack_120,dsfmt->status[1].u[0],(bool *)&vStack_98,(allocator_type *)&uStack_14c);
  uVar4 = *(uint64_t *)((long)dsfmt->status + 0x188);
  if (dsfmt->status[0x19].u[0] != uVar4) {
    dsfmt->status[0x19].u[0] = uVar4;
  }
  if (uVar17 != 0) {
    pvStack_80 = (vector<unsigned_int,std::allocator<unsigned_int>> *)((long)dsfmt->status + 0x188);
    sStack_138 = (size_type)(int)uStack_130;
    lStack_78 = sStack_138 * 4 + -4;
    lStack_c8 = 0;
    pdStack_148 = dsfmt;
    do {
      iVar14 = 9;
      lVar8 = (long)vStack_f8.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar17].
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)vStack_f8.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar17].
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (lVar8 != 0) {
        pvStack_58 = vStack_f8.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar17;
        lVar22 = lVar8 >> 2;
        uStack_60 = uVar17 - 1;
        lStack_a8 = 1 - lVar22;
        lStack_a0 = lVar8 + -4;
        uStack_128 = uVar17;
        lStack_70 = uVar17 * 3;
        do {
          uStack_14c = (pvStack_58->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                       ._M_impl.super__Vector_impl_data._M_start[lVar22 + -1];
          uVar10 = vStack_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[uStack_14c];
          if (uVar10 < uStack_128) {
            pvVar2 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                     (vStack_f8.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar10);
            iVar3._M_current = *(uint **)(pvVar2 + 8);
            if (iVar3._M_current == *(uint **)(pvVar2 + 0x10)) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar3,&uStack_14c);
              iVar14 = 10;
            }
            else {
              *iVar3._M_current = uStack_14c;
              *(uint **)(pvVar2 + 8) = iVar3._M_current + 1;
              iVar14 = 10;
            }
          }
          else {
            if ((iStack_12c == 2) ||
               ((iStack_12c == 1 &&
                ((long)(pdStack_148->status[0x19].u[0] -
                       *(long *)((long)pdStack_148->status + 0x188)) >> 2 == sStack_138)))) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        (&vStack_98,sStack_138,&aStack_139);
              uVar17 = (ulong)uStack_130;
              lVar8 = lVar22;
              if (uStack_130 != 0) {
                puVar6 = (&((vStack_f8.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_start)[lStack_70];
                lVar27 = 0;
                do {
                  lVar8 = lVar27;
                  if (lVar22 + lVar8 == 0) {
                    uVar17 = sStack_138 + lVar8;
                    goto LAB_0010522e;
                  }
                  *(int *)(CONCAT71(vStack_98.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._1_7_,
                                    vStack_98.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._0_1_) + lStack_78 +
                          lVar8 * 4) =
                       (int)vStack_e0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start
                            [*(uint *)((long)puVar6 + lVar8 * 4 + lStack_a0)];
                  lVar27 = lVar8 + -1;
                } while (sStack_138 + lVar8 + -1 != 0);
                uVar17 = 0;
LAB_0010522e:
                lVar8 = lVar8 - lStack_a8;
              }
              bVar33 = (int)uVar17 == 0;
              uVar24 = uStack_128;
              if (!bVar33) {
                uVar24 = uStack_60;
                if (uStack_60 == 0) {
                  uVar24 = 0;
                }
                else {
                  do {
                    puVar6 = vStack_f8.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar24].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish;
                    lVar27 = (long)puVar6 -
                             (long)vStack_f8.
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar24].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2;
                    lVar29 = (long)(int)uVar17;
                    lVar8 = 0;
                    do {
                      lVar20 = lVar8;
                      if (lVar27 + lVar20 == 0) {
                        uVar17 = lVar29 + lVar20;
                        goto LAB_001052b4;
                      }
                      *(int *)(CONCAT71(vStack_98.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                        vStack_98.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                               lVar29 * 4 + -4 + lVar20 * 4) =
                           (int)vStack_e0.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start[puVar6[lVar20 + -1]];
                      lVar8 = lVar20 + -1;
                    } while (lVar29 + lVar20 + -1 != 0);
                    uVar17 = 0;
LAB_001052b4:
                    bVar33 = (int)uVar17 == 0;
                    if (bVar33) goto LAB_001052c2;
                    uVar24 = uVar24 - 1;
                  } while (uVar24 != 0);
                  uVar24 = 0;
LAB_001052c2:
                  lVar8 = lVar20 + lVar27 + -1;
                }
              }
              puVar12 = (uint *)CONCAT71(vStack_98.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                         vStack_98.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_1_);
              uVar17 = (long)vStack_98.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)puVar12 >> 2;
              if ((1 < uVar17) && (1 < uVar17 + 1)) {
                uVar30 = uVar17 + 1 >> 1;
                do {
                  uVar31 = uVar30 - 1;
                  uVar16 = puVar12[uVar30 - 1];
                  uVar21 = uVar30 * 2 - 1;
                  uVar32 = uVar31;
                  if (uVar21 < uVar17) {
                    lVar27 = uVar30 * 2 + -2;
                    do {
                      if ((lVar27 + 2U == uVar17) ||
                         (uVar30 = lVar27 + 2U, puVar12[uVar21] < puVar12[lVar27 + 2])) {
                        uVar30 = uVar21;
                      }
                      if (uVar16 <= puVar12[uVar30]) break;
                      puVar12[uVar32] = puVar12[uVar30];
                      lVar27 = uVar30 * 2;
                      uVar21 = uVar30 * 2 + 1;
                      uVar32 = uVar30;
                    } while (uVar21 < uVar17);
                  }
                  puVar12[uVar32] = uVar16;
                  uVar30 = uVar31;
                } while (uVar31 != 0);
              }
              if (bVar33) {
                do {
                  bVar34 = lVar8 == 0;
                  lVar8 = lVar8 + -1;
                  if (bVar34) break;
                  if (*puVar12 < uVar24) {
                    uVar30 = vStack_e0.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start
                             [vStack_f8.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar24].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[lVar8]];
                    if (*puVar12 < uVar30) {
                      if (uVar17 < 2) {
                        uVar21 = 0;
                      }
                      else {
                        uVar32 = 1;
                        lVar27 = 0;
                        uVar21 = 0;
                        do {
                          if ((lVar27 + 2U == uVar17) ||
                             (uVar31 = lVar27 + 2U, puVar12[uVar32] < puVar12[lVar27 + 2])) {
                            uVar31 = uVar32;
                          }
                          if (uVar30 <= puVar12[uVar31]) break;
                          puVar12[uVar21] = puVar12[uVar31];
                          lVar27 = uVar31 * 2;
                          uVar32 = uVar31 * 2 + 1;
                          uVar21 = uVar31;
                        } while (uVar32 < uVar17);
                      }
                      puVar12[uVar21] = (uint)uVar30;
                    }
                  }
                  else {
                    bVar33 = false;
                  }
                } while (bVar33);
              }
              if (bVar33) {
                pvStack_50 = vStack_f8.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                do {
                  uVar24 = uVar24 - 1;
                  if (uVar24 == 0) break;
                  if (bVar33) {
                    puVar6 = vStack_f8.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar24].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start;
                    lVar8 = (long)vStack_f8.
                                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar24].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 2;
                    do {
                      bVar34 = lVar8 == 0;
                      lVar8 = lVar8 + -1;
                      if (bVar34) break;
                      if (*puVar12 < uVar24) {
                        uVar30 = vStack_e0.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start[puVar6[lVar8]];
                        if (*puVar12 < uVar30) {
                          if (uVar17 < 2) {
                            uVar21 = 0;
                          }
                          else {
                            uVar32 = 1;
                            lVar27 = 0;
                            uVar21 = 0;
                            do {
                              if ((lVar27 + 2U == uVar17) ||
                                 (uVar31 = lVar27 + 2U, puVar12[uVar32] < puVar12[lVar27 + 2])) {
                                uVar31 = uVar32;
                              }
                              if (uVar30 <= puVar12[uVar31]) break;
                              puVar12[uVar21] = puVar12[uVar31];
                              lVar27 = uVar31 * 2;
                              uVar32 = uVar31 * 2 + 1;
                              uVar21 = uVar31;
                            } while (uVar32 < uVar17);
                          }
                          puVar12[uVar21] = (uint)uVar30;
                        }
                      }
                      else {
                        bVar33 = false;
                      }
                    } while (bVar33);
                  }
                } while (bVar33);
              }
              lVar8 = 0;
              for (puVar11 = puVar12;
                  puVar11 !=
                  vStack_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish; puVar11 = puVar11 + 1) {
                lVar8 = lVar8 + (ulong)*puVar11;
              }
              lVar8 = lVar8 + lStack_c8;
              auVar36._8_4_ = (int)((ulong)lVar8 >> 0x20);
              auVar36._0_8_ = lVar8;
              auVar36._12_4_ = 0x45300000;
              uVar4 = pdStack_148->status[1].u[0];
              auVar37._8_4_ = (int)(uVar4 >> 0x20);
              auVar37._0_8_ = uVar4;
              auVar37._12_4_ = 0x45300000;
              dVar35 = ((double)pdStack_148->status[0].u32[0] *
                       ((auVar36._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0))) /
                       ((auVar37._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0));
              pdStack_148->status[2].d[0] = dVar35;
              if (dVar35 < *(double *)((long)pdStack_148->status + 0x28)) {
                *(double *)((long)pdStack_148->status + 0x28) = dVar35;
              }
              uStack_c0 = uVar10;
              if (puVar12 != (uint *)0x0) {
                operator_delete(puVar12,(long)vStack_98.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)puVar12);
              }
            }
            iVar3._M_current = *(uint **)(pdStack_148->status + 0x19);
            if ((ulong)((long)iVar3._M_current - *(long *)((long)pdStack_148->status + 0x188) >> 2)
                < sStack_138) {
              if (iVar3._M_current == *(uint **)((long)pdStack_148->status + 0x198)) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>(pvStack_80,iVar3,&uStack_14c);
              }
              else {
                *iVar3._M_current = uStack_14c;
                pdStack_148->status[0x19].u[0] = (uint64_t)(iVar3._M_current + 1);
              }
              lStack_c8 = lStack_c8 + uVar10;
              uVar10 = (ulong)uStack_14c;
              vStack_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar10] = 0;
              puVar19 = *(ulong **)(pdStack_148->status[0xb].u[0] + uVar10 * 0x18);
              puVar5 = *(ulong **)(pdStack_148->status[0xb].u[0] + 8 + uVar10 * 0x18);
              iVar14 = 0;
              if (puVar19 != puVar5) {
                lVar8 = *(long *)((long)pdStack_148->status + 200);
                do {
                  uVar10 = *puVar19;
                  uVar17 = uVar10 + 0x3f;
                  if (-1 < (long)uVar10) {
                    uVar17 = uVar10;
                  }
                  uVar24 = (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001);
                  if ((vStack_120.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [((long)uVar17 >> 6) + (uVar24 - 1)] >> (uVar10 & 0x3f) & 1) == 0) {
                    vStack_120.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                    [((long)uVar17 >> 6) + (uVar24 - 1)] =
                         vStack_120.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [((long)uVar17 >> 6) + (uVar24 - 1)] | 1L << ((byte)uVar10 & 0x3f);
                    puVar11 = *(uint **)(lVar8 + 8 + uVar10 * 0x18);
                    for (puVar12 = *(uint **)(lVar8 + uVar10 * 0x18); puVar12 != puVar11;
                        puVar12 = puVar12 + 1) {
                      if (vStack_e0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[*puVar12] != 0) {
                        vStack_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[*puVar12] =
                             vStack_e0.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[*puVar12] - 1;
                      }
                    }
                  }
                  puVar19 = puVar19 + 1;
                  iVar14 = 0;
                } while (puVar19 != puVar5);
              }
            }
            else {
              uVar16 = pdStack_148->status[0].u32[0];
              uStack_c0 = pdStack_148->status[1].u[0];
              uStack_b8 = 0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"  >>>[greedy-lazy] influence: ",0x1e);
              auVar38._8_4_ = (int)((ulong)lStack_c8 >> 0x20);
              auVar38._0_8_ = lStack_c8;
              auVar38._12_4_ = 0x45300000;
              auVar39._8_4_ = (int)(uStack_c0 >> 0x20);
              auVar39._0_8_ = uStack_c0;
              auVar39._12_4_ = 0x45300000;
              dStack_68 = ((double)uVar16 *
                          ((auVar38._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lStack_c8) - 4503599627370496.0))) /
                          ((auVar39._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uStack_c0) - 4503599627370496.0));
              poVar9 = std::ostream::_M_insert<double>(dStack_68);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,", min-bound: ",0xd);
              poVar9 = std::ostream::_M_insert<double>
                                 (*(double *)((long)pdStack_148->status + 0x28));
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,", last-bound: ",0xe);
              poVar9 = std::ostream::_M_insert<double>(pdStack_148->status[2].d[0]);
              vStack_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start._0_1_ = 10;
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&vStack_98,1);
              iVar14 = 1;
            }
          }
          uVar17 = uStack_128;
          if ((iVar14 != 10) && (iVar14 != 0)) goto LAB_0010582b;
          lVar22 = lVar22 + -1;
          lStack_a8 = lStack_a8 + 1;
          lStack_a0 = lStack_a0 + -4;
        } while (lVar22 != 0);
        iVar14 = 9;
      }
LAB_0010582b:
      pvVar7 = vStack_f8.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar14 == 9) {
        puVar6 = vStack_f8.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar14 = 0;
        pvVar7 = vStack_f8.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        if (puVar6 != (pointer)0x0) {
          pvVar7 = vStack_f8.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
          vStack_f8.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               vStack_f8.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
          operator_delete(puVar6,(long)(pvVar7->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)puVar6);
          pvVar7 = vStack_f8.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      vStack_f8.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pvVar7;
    } while ((iVar14 == 0) && (uVar17 = uVar17 - 1, uVar17 != 0));
  }
  if (vStack_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(vStack_120.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)vStack_120.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)vStack_120.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    vStack_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    vStack_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    vStack_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    vStack_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._M_offset = 0;
    vStack_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&vStack_f8);
  if (vStack_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_e0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_e0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void dsfmt_chk_init_by_array(dsfmt_t* dsfmt, uint32_t init_key[],
                             int key_length, int mexp)
{
	int i, j, count;
	uint32_t r;
	uint32_t* psfmt32;
	int lag;
	int mid;
	int size = (DSFMT_N + 1) * 4; /* pulmonary */

	/* make sure caller program is compiled with the same MEXP */
	if (mexp != dsfmt_mexp)
	{
		fprintf(stderr, "DSFMT_MEXP doesn't match with dSFMT.c\n");
		exit(1);
	}
	if (size >= 623)
	{
		lag = 11;
	}
	else if (size >= 68)
	{
		lag = 7;
	}
	else if (size >= 39)
	{
		lag = 5;
	}
	else
	{
		lag = 3;
	}
	mid = (size - lag) / 2;

	psfmt32 = &dsfmt->status[0].u32[0];
	memset(dsfmt->status, 0x8b, sizeof(dsfmt->status));
	if (key_length + 1 > size)
	{
		count = key_length + 1;
	}
	else
	{
		count = size;
	}
	r = ini_func1(psfmt32[idxof(0)] ^ psfmt32[idxof(mid % size)]
		^ psfmt32[idxof((size - 1) % size)]);
	psfmt32[idxof(mid % size)] += r;
	r += key_length;
	psfmt32[idxof((mid + lag) % size)] += r;
	psfmt32[idxof(0)] = r;
	count--;
	for (i = 1, j = 0; (j < count) && (j < key_length); j++)
	{
		r = ini_func1(psfmt32[idxof(i)]
			^ psfmt32[idxof((i + mid) % size)]
			^ psfmt32[idxof((i + size - 1) % size)]);
		psfmt32[idxof((i + mid) % size)] += r;
		r += init_key[j] + i;
		psfmt32[idxof((i + mid + lag) % size)] += r;
		psfmt32[idxof(i)] = r;
		i = (i + 1) % size;
	}
	for (; j < count; j++)
	{
		r = ini_func1(psfmt32[idxof(i)]
			^ psfmt32[idxof((i + mid) % size)]
			^ psfmt32[idxof((i + size - 1) % size)]);
		psfmt32[idxof((i + mid) % size)] += r;
		r += i;
		psfmt32[idxof((i + mid + lag) % size)] += r;
		psfmt32[idxof(i)] = r;
		i = (i + 1) % size;
	}
	for (j = 0; j < size; j++)
	{
		r = ini_func2(psfmt32[idxof(i)]
			+ psfmt32[idxof((i + mid) % size)]
			+ psfmt32[idxof((i + size - 1) % size)]);
		psfmt32[idxof((i + mid) % size)] ^= r;
		r -= i;
		psfmt32[idxof((i + mid + lag) % size)] ^= r;
		psfmt32[idxof(i)] = r;
		i = (i + 1) % size;
	}
	initial_mask(dsfmt);
	period_certification(dsfmt);
	dsfmt->idx = DSFMT_N64;
}